

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_blocking_connection(config config)

{
  config config_00;
  undefined1 auVar1 [80];
  int iVar3;
  redisContext *c_00;
  int *piVar4;
  undefined8 uVar5;
  char *in_stack_ffffffffffffffe0;
  redisReply *reply;
  redisContext *c;
  undefined1 auVar2 [32];
  
  auVar1 = config._0_80_;
  config_00.ssl.key = in_stack_ffffffffffffffe0;
  auVar2 = auVar1._8_32_;
  config_00.type = auVar1._0_4_;
  config_00._4_4_ = auVar1._4_4_;
  config_00.tcp.host = (char *)auVar2._0_8_;
  config_00.tcp.port = auVar2._8_4_;
  config_00.tcp._12_4_ = auVar2._12_4_;
  config_00.tcp.timeout.tv_sec = SUB168(auVar2._16_16_,0);
  config_00.tcp.timeout.tv_usec = SUB168(auVar2._16_16_,8);
  config_00.unix_sock.path = (char *)auVar1._40_8_;
  config_00.ssl.host = (char *)auVar1._48_8_;
  config_00.ssl.port = auVar1._56_4_;
  config_00.ssl._12_4_ = auVar1._60_4_;
  config_00.ssl.ca_cert = (char *)auVar1._64_8_;
  config_00.ssl.cert = (char *)auVar1._72_8_;
  c_00 = do_connect(config_00);
  tests = tests + 1;
  printf("#%02d ");
  printf("Is able to deliver commands: ");
  piVar4 = (int *)redisCommand(c_00,"PING");
  if (*piVar4 == 5) {
    iVar3 = strcasecmp(*(char **)(piVar4 + 8),"pong");
    if (iVar3 != 0) goto LAB_00104749;
    printf("\x1b[0;32mPASSED\x1b[0;0m\n");
  }
  else {
LAB_00104749:
    printf("\x1b[0;31mFAILED\x1b[0;0m\n");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Is a able to send commands verbatim: ");
  piVar4 = (int *)redisCommand(c_00,"SET foo bar");
  if (*piVar4 == 5) {
    iVar3 = strcasecmp(*(char **)(piVar4 + 8),"ok");
    if (iVar3 != 0) goto LAB_001047e2;
    printf("\x1b[0;32mPASSED\x1b[0;0m\n");
  }
  else {
LAB_001047e2:
    printf("\x1b[0;31mFAILED\x1b[0;0m\n");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("%%s String interpolation works: ");
  uVar5 = redisCommand(c_00,"SET %s %s","foo","hello world");
  freeReplyObject(uVar5);
  piVar4 = (int *)redisCommand(c_00,"GET foo");
  if (*piVar4 == 1) {
    iVar3 = strcmp(*(char **)(piVar4 + 8),"hello world");
    if (iVar3 != 0) goto LAB_001048a8;
    printf("\x1b[0;32mPASSED\x1b[0;0m\n");
  }
  else {
LAB_001048a8:
    printf("\x1b[0;31mFAILED\x1b[0;0m\n");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("%%b String interpolation works: ");
  uVar5 = redisCommand(c_00,"SET %b %b","foo",3,"hello",0xb);
  freeReplyObject(uVar5);
  piVar4 = (int *)redisCommand(c_00,"GET foo");
  if (*piVar4 == 1) {
    iVar3 = memcmp(*(void **)(piVar4 + 8),"hello",0xb);
    if (iVar3 != 0) goto LAB_0010497e;
    printf("\x1b[0;32mPASSED\x1b[0;0m\n");
  }
  else {
LAB_0010497e:
    printf("\x1b[0;31mFAILED\x1b[0;0m\n");
    fails = fails + 1;
  }
  tests = tests + 1;
  printf("#%02d ");
  printf("Binary reply length is correct: ");
  if (*(long *)(piVar4 + 6) == 0xb) {
    printf("\x1b[0;32mPASSED\x1b[0;0m\n");
  }
  else {
    printf("\x1b[0;31mFAILED\x1b[0;0m\n");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Can parse nil replies: ");
  piVar4 = (int *)redisCommand(c_00,"GET nokey");
  if (*piVar4 == 4) {
    printf("\x1b[0;32mPASSED\x1b[0;0m\n");
  }
  else {
    printf("\x1b[0;31mFAILED\x1b[0;0m\n");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Can parse integer replies: ");
  piVar4 = (int *)redisCommand(c_00,"INCR mycounter");
  if ((*piVar4 == 3) && (*(long *)(piVar4 + 2) == 1)) {
    printf("\x1b[0;32mPASSED\x1b[0;0m\n");
  }
  else {
    printf("\x1b[0;31mFAILED\x1b[0;0m\n");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Can parse multi bulk replies: ");
  uVar5 = redisCommand(c_00,"LPUSH mylist foo");
  freeReplyObject(uVar5);
  uVar5 = redisCommand(c_00,"LPUSH mylist bar");
  freeReplyObject(uVar5);
  piVar4 = (int *)redisCommand(c_00,"LRANGE mylist 0 -1");
  if ((*piVar4 == 2) && (*(long *)(piVar4 + 10) == 2)) {
    iVar3 = memcmp(*(void **)(**(long **)(piVar4 + 0xc) + 0x20),"bar",3);
    if (iVar3 != 0) goto LAB_00104bf6;
    iVar3 = memcmp(*(void **)(*(long *)(*(long *)(piVar4 + 0xc) + 8) + 0x20),"foo",3);
    if (iVar3 != 0) goto LAB_00104bf6;
    printf("\x1b[0;32mPASSED\x1b[0;0m\n");
  }
  else {
LAB_00104bf6:
    printf("\x1b[0;31mFAILED\x1b[0;0m\n");
    fails = fails + 1;
  }
  freeReplyObject(piVar4);
  tests = tests + 1;
  printf("#%02d ");
  printf("Can handle nested multi bulk replies: ");
  uVar5 = redisCommand(c_00,"MULTI");
  freeReplyObject(uVar5);
  uVar5 = redisCommand(c_00,"LRANGE mylist 0 -1");
  freeReplyObject(uVar5);
  uVar5 = redisCommand(c_00,"PING");
  freeReplyObject(uVar5);
  piVar4 = (int *)redisCommand(c_00);
  if ((((*piVar4 == 2) && (*(long *)(piVar4 + 10) == 2)) &&
      (*(int *)**(undefined8 **)(piVar4 + 0xc) == 2)) &&
     (*(long *)(**(long **)(piVar4 + 0xc) + 0x28) == 2)) {
    iVar3 = memcmp(*(void **)(**(long **)(**(long **)(piVar4 + 0xc) + 0x30) + 0x20),"bar",3);
    if (iVar3 == 0) {
      iVar3 = memcmp(*(void **)(*(long *)(*(long *)(**(long **)(piVar4 + 0xc) + 0x30) + 8) + 0x20),
                     "foo",3);
      if ((iVar3 == 0) && (**(int **)(*(long *)(piVar4 + 0xc) + 8) == 5)) {
        iVar3 = strcasecmp(*(char **)(*(long *)(*(long *)(piVar4 + 0xc) + 8) + 0x20),"pong");
        if (iVar3 == 0) {
          printf("\x1b[0;32mPASSED\x1b[0;0m\n");
          goto LAB_00104da9;
        }
      }
    }
  }
  printf("\x1b[0;31mFAILED\x1b[0;0m\n");
  fails = fails + 1;
LAB_00104da9:
  freeReplyObject(piVar4);
  disconnect(c_00,0);
  return;
}

Assistant:

static void test_blocking_connection(struct config config) {
    redisContext *c;
    redisReply *reply;

    c = do_connect(config);

    test("Is able to deliver commands: ");
    reply = redisCommand(c,"PING");
    test_cond(reply->type == REDIS_REPLY_STATUS &&
        strcasecmp(reply->str,"pong") == 0)
    freeReplyObject(reply);

    test("Is a able to send commands verbatim: ");
    reply = redisCommand(c,"SET foo bar");
    test_cond (reply->type == REDIS_REPLY_STATUS &&
        strcasecmp(reply->str,"ok") == 0)
    freeReplyObject(reply);

    test("%%s String interpolation works: ");
    reply = redisCommand(c,"SET %s %s","foo","hello world");
    freeReplyObject(reply);
    reply = redisCommand(c,"GET foo");
    test_cond(reply->type == REDIS_REPLY_STRING &&
        strcmp(reply->str,"hello world") == 0);
    freeReplyObject(reply);

    test("%%b String interpolation works: ");
    reply = redisCommand(c,"SET %b %b","foo",(size_t)3,"hello\x00world",(size_t)11);
    freeReplyObject(reply);
    reply = redisCommand(c,"GET foo");
    test_cond(reply->type == REDIS_REPLY_STRING &&
        memcmp(reply->str,"hello\x00world",11) == 0)

    test("Binary reply length is correct: ");
    test_cond(reply->len == 11)
    freeReplyObject(reply);

    test("Can parse nil replies: ");
    reply = redisCommand(c,"GET nokey");
    test_cond(reply->type == REDIS_REPLY_NIL)
    freeReplyObject(reply);

    /* test 7 */
    test("Can parse integer replies: ");
    reply = redisCommand(c,"INCR mycounter");
    test_cond(reply->type == REDIS_REPLY_INTEGER && reply->integer == 1)
    freeReplyObject(reply);

    test("Can parse multi bulk replies: ");
    freeReplyObject(redisCommand(c,"LPUSH mylist foo"));
    freeReplyObject(redisCommand(c,"LPUSH mylist bar"));
    reply = redisCommand(c,"LRANGE mylist 0 -1");
    test_cond(reply->type == REDIS_REPLY_ARRAY &&
              reply->elements == 2 &&
              !memcmp(reply->element[0]->str,"bar",3) &&
              !memcmp(reply->element[1]->str,"foo",3))
    freeReplyObject(reply);

    /* m/e with multi bulk reply *before* other reply.
     * specifically test ordering of reply items to parse. */
    test("Can handle nested multi bulk replies: ");
    freeReplyObject(redisCommand(c,"MULTI"));
    freeReplyObject(redisCommand(c,"LRANGE mylist 0 -1"));
    freeReplyObject(redisCommand(c,"PING"));
    reply = (redisCommand(c,"EXEC"));
    test_cond(reply->type == REDIS_REPLY_ARRAY &&
              reply->elements == 2 &&
              reply->element[0]->type == REDIS_REPLY_ARRAY &&
              reply->element[0]->elements == 2 &&
              !memcmp(reply->element[0]->element[0]->str,"bar",3) &&
              !memcmp(reply->element[0]->element[1]->str,"foo",3) &&
              reply->element[1]->type == REDIS_REPLY_STATUS &&
              strcasecmp(reply->element[1]->str,"pong") == 0);
    freeReplyObject(reply);

    disconnect(c, 0);
}